

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::escape_basic_string
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,string_type *s)

{
  byte __c;
  size_type sVar1;
  pointer pcVar2;
  char cVar3;
  size_type sVar4;
  long *local_60;
  size_type local_58;
  long local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  serializer<toml::type_config> *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = s->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    local_38 = this;
    do {
      __c = pcVar2[sVar4];
      if (0x1a < __c) {
        if (__c == 0x1b) {
          if ((local_38->spec_).v1_1_0_add_escape_sequence_e != true) goto LAB_003cf846;
          local_60 = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\e","");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,(char *)local_60,local_58);
        }
        else if (__c == 0x22) {
          local_60 = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\\"","");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,(char *)local_60,local_58);
        }
        else {
          if (__c != 0x5c) goto switchD_003cf647_caseD_b;
          local_60 = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\\\","");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,(char *)local_60,local_58);
        }
        goto LAB_003cf808;
      }
      switch(__c) {
      case 8:
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\b","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_60,local_58);
        break;
      case 9:
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\t","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_60,local_58);
        break;
      case 10:
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\n","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_60,local_58);
        break;
      default:
switchD_003cf647_caseD_b:
        if ((__c < 9) || (__c == 0x7f || (byte)(__c - 10) < 0x16)) {
LAB_003cf846:
          if ((local_38->spec_).v1_1_0_add_escape_sequence_x == true) {
            local_60 = local_50;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\x","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_60,local_58);
          }
          else {
            local_60 = local_50;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\u00","");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,(char *)local_60,local_58);
          }
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,__c >> 4 | 0x30);
          cVar3 = '0';
          if (9 < (__c & 0xf)) {
            cVar3 = '7';
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,(__c & 0xf) + cVar3);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,__c);
        }
        goto LAB_003cf8fe;
      case 0xc:
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\f","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_60,local_58);
        break;
      case 0xd:
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\\r","");
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,(char *)local_60,local_58);
      }
LAB_003cf808:
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
LAB_003cf8fe:
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type escape_basic_string(const string_type& s) const // {{{
    {
        string_type retval;
        for(const char_type c : s)
        {
            switch(c)
            {
                case char_type('\\'): {retval += string_conv<string_type>("\\\\"); break;}
                case char_type('\"'): {retval += string_conv<string_type>("\\\""); break;}
                case char_type('\b'): {retval += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {retval += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {retval += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {retval += string_conv<string_type>("\\n" ); break;}
                case char_type('\r'): {retval += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    if(c == char_type(0x1B) && spec_.v1_1_0_add_escape_sequence_e)
                    {
                        retval += string_conv<string_type>("\\e");
                    }
                    else if((char_type(0x00) <= c && c <= char_type(0x08)) ||
                            (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                             c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            retval += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            retval += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        retval += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            retval += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            retval += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        retval += c;
                    }
                }
            }
        }
        return retval;
    }